

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int verify_struct(flatbuffers_uoffset_t end,flatbuffers_uoffset_t base,flatbuffers_uoffset_t offset,
                 flatbuffers_uoffset_t size,uint16_t align)

{
  uint uVar1;
  int c_2;
  int c_1;
  int c;
  uint16_t align_local;
  flatbuffers_uoffset_t size_local;
  flatbuffers_uoffset_t offset_local;
  flatbuffers_uoffset_t base_local;
  flatbuffers_uoffset_t end_local;
  
  if ((offset == 0) || (end < base + offset)) {
    base_local = 0x12;
  }
  else {
    uVar1 = offset + base;
    if (uVar1 + size < uVar1) {
      base_local = 10;
    }
    else if (end < uVar1 + size) {
      base_local = 9;
    }
    else if ((uVar1 & align - 1) == 0) {
      base_local = 0;
    }
    else {
      base_local = 0xb;
    }
  }
  return base_local;
}

Assistant:

static inline int verify_struct(uoffset_t end, uoffset_t base, uoffset_t offset, uoffset_t size, uint16_t align)
{
    /* Structs can have zero size so `end` is a valid value. */
    if (offset == 0 || base + offset > end) {
        return flatcc_verify_error_offset_out_of_range;
    }
    base += offset;
    verify(base + size >= base, flatcc_verify_error_struct_size_overflow);
    verify(base + size <= end, flatcc_verify_error_struct_out_of_range);
    verify (!(base & (align - 1u)), flatcc_verify_error_struct_unaligned);
    return flatcc_verify_ok;
}